

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructRMW
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructRMW *curr)

{
  Literal *other;
  Literal *other_00;
  shared_ptr<wasm::GCData> sVar1;
  undefined1 local_128 [8];
  Flow ref;
  Flow value;
  Literal oldVal;
  undefined1 local_68 [8];
  shared_ptr<wasm::GCData> data;
  Literal newVal;
  
  visit((Flow *)local_128,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len != 0) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_128);
    goto LAB_00d538c5;
  }
  visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,curr->value);
  if (value.breakTo.super_IString.str._M_len != 0) {
    Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    goto LAB_00d538b9;
  }
  Flow::getSingleValue((Flow *)local_128);
  sVar1 = Literal::getGCData((Literal *)local_68);
  if (local_68 == (undefined1  [8])0x0) {
    (*this->_vptr_ExpressionRunner[2])
              (this,"null ref",
               sVar1.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _M_pi);
  }
  other_00 = (((element_type *)local_68)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start + ((ulong)curr->index - 1);
  if ((ulong)curr->index == 0) {
    other_00 = (((element_type *)local_68)->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
               _M_elems;
  }
  Literal::Literal((Literal *)&value.breakTo.super_IString.str._M_str,other_00);
  other = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
  Literal::Literal((Literal *)
                   &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   other);
  switch(curr->op) {
  case RMWAdd:
    Literal::add((Literal *)&newVal.type,other_00,
                 (Literal *)
                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Literal::operator=(other_00,(Literal *)&newVal.type);
    break;
  case RMWSub:
    Literal::sub((Literal *)&newVal.type,other_00,
                 (Literal *)
                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Literal::operator=(other_00,(Literal *)&newVal.type);
    break;
  case RMWAnd:
    Literal::and_((Literal *)&newVal.type,other_00,
                  (Literal *)
                  &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Literal::operator=(other_00,(Literal *)&newVal.type);
    break;
  case RMWOr:
    Literal::or_((Literal *)&newVal.type,other_00,
                 (Literal *)
                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Literal::operator=(other_00,(Literal *)&newVal.type);
    break;
  case RMWXor:
    Literal::xor_((Literal *)&newVal.type,other_00,
                  (Literal *)
                  &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Literal::operator=(other_00,(Literal *)&newVal.type);
    break;
  case RMWXchg:
    Literal::operator=(other_00,(Literal *)
                                &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
  default:
    goto switchD_00d537d7_default;
  }
  Literal::~Literal((Literal *)&newVal.type);
switchD_00d537d7_default:
  Literal::Literal((Literal *)&oldVal.type,(Literal *)&value.breakTo.super_IString.str._M_str);
  Flow::Flow(__return_storage_ptr__,(Literal *)&oldVal.type);
  Literal::~Literal((Literal *)&oldVal.type);
  Literal::~Literal((Literal *)
                    &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Literal::~Literal((Literal *)&value.breakTo.super_IString.str._M_str);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
LAB_00d538b9:
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
LAB_00d538c5:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_128);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructRMW(StructRMW* curr) {
    NOTE_ENTER("StructRMW");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto& field = data->values[curr->index];
    auto oldVal = field;
    auto newVal = value.getSingleValue();
    switch (curr->op) {
      case RMWAdd:
        field = field.add(newVal);
        break;
      case RMWSub:
        field = field.sub(newVal);
        break;
      case RMWAnd:
        field = field.and_(newVal);
        break;
      case RMWOr:
        field = field.or_(newVal);
        break;
      case RMWXor:
        field = field.xor_(newVal);
        break;
      case RMWXchg:
        field = newVal;
        break;
    }
    return oldVal;
  }